

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<ProKey,QMakeInternal::QMakeBuiltin>::emplace_helper<QMakeInternal::QMakeBuiltin_const&>
          (QHash<ProKey,QMakeInternal::QMakeBuiltin> *this,ProKey *key,QMakeBuiltin *args)

{
  Data *pDVar1;
  piter pVar2;
  int iVar3;
  ProString *this_00;
  long in_FS_OFFSET;
  undefined1 local_48 [32];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_>::findOrInsert<ProKey>
            ((InsertionResult *)local_48,
             *(Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_> **)this,key);
  this_00 = (ProString *)
            ((*(Span **)(local_48._0_8_ + 0x20))[(ulong)local_48._8_8_ >> 7].entries +
            (*(Span **)(local_48._0_8_ + 0x20))[(ulong)local_48._8_8_ >> 7].offsets
            [(uint)local_48._8_8_ & 0x7f]);
  if (local_48[0x10] == false) {
    ProString::ProString(this_00,&key->super_ProString);
    pDVar1 = (args->usage).d.d;
    this_00[1].m_string.d.d = pDVar1;
    this_00[1].m_string.d.ptr = (args->usage).d.ptr;
    this_00[1].m_string.d.size = (args->usage).d.size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
      UNLOCK();
    }
    this_00[1].m_file = args->maxArgs;
    iVar3 = args->minArgs;
    this_00[1].m_offset = args->index;
    this_00[1].m_length = iVar3;
  }
  else {
    QHashPrivate::Node<ProKey,QMakeInternal::QMakeBuiltin>::
    emplaceValue<QMakeInternal::QMakeBuiltin_const&>
              ((Node<ProKey,QMakeInternal::QMakeBuiltin> *)this_00,args);
  }
  pVar2.bucket = local_48._8_8_;
  pVar2.d = (Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_> *)local_48._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (iterator)pVar2;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }